

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

RealType __thiscall OpenMD::EAMAdapter::getLatticeConstant(EAMAdapter *this)

{
  EAMParameters eamParam;
  undefined1 local_38 [40];
  RealType local_10;
  
  getEAMParam((EAMParameters *)local_38,this);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  return local_10;
}

Assistant:

RealType EAMAdapter::getLatticeConstant() {
    EAMParameters eamParam = getEAMParam();
    return eamParam.latticeConstant;
  }